

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_file_time(archive *_a,wchar_t flag,char *pathname)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  wchar_t r;
  char *in_stack_00000068;
  wchar_t in_stack_00000074;
  archive_match *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  local_4 = validate_time_flag((archive *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               (wchar_t)((ulong)in_RDX >> 0x20),
                               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                              );
  if (local_4 == L'\0') {
    local_4 = set_timefilter_pathname_mbs(in_stack_00000078,in_stack_00000074,in_stack_00000068);
  }
  return local_4;
}

Assistant:

int
archive_match_include_file_time(struct archive *_a, int flag,
    const char *pathname)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_file_time");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_pathname_mbs((struct archive_match *)_a,
			flag, pathname);
}